

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O3

Value __thiscall xmrig::OclPlatform::toJSON(OclPlatform *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  long in_RDX;
  long extraout_RDX;
  long extraout_RDX_00;
  Value VVar1;
  Data local_78;
  String local_68;
  Data local_58;
  StringRefType local_40;
  
  if ((doc->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.n.i64 == 0) {
    this->m_id = (cl_platform_id)0x0;
    this->m_index = 0;
  }
  else {
    allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
    this->m_id = (cl_platform_id)0x0;
    this->m_index = 0;
    *(undefined2 *)((long)&this->m_index + 6) = 3;
    local_40.s = "index";
    local_40.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this,&local_40,
               (unsigned_long)
               (doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ).data_.s.str,allocator);
    OclLib::getString((OclLib *)&local_78.s,
                      (cl_platform_id)
                      (doc->
                      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ).data_.n,0x900);
    String::toJSON(&local_68,(Document *)&local_78.s);
    local_58.s.str = (Ch *)0x40500000018d13e;
    local_58.n = (Number)0x7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_58.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68,allocator);
    if (local_78.n.i64 != 0) {
      operator_delete__((void *)local_78.n);
    }
    OclLib::getString((OclLib *)&local_78.s,
                      (cl_platform_id)
                      (doc->
                      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ).data_.n,0x901);
    String::toJSON(&local_68,(Document *)&local_78.s);
    local_58.s.str = (Ch *)0x40500000018ae83;
    local_58.n = (Number)0x7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_58.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68,allocator);
    if (local_78.n.i64 != 0) {
      operator_delete__((void *)local_78.n);
    }
    OclLib::getString((OclLib *)&local_78.s,
                      (cl_platform_id)
                      (doc->
                      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ).data_.n,0x902);
    String::toJSON(&local_68,(Document *)&local_78.s);
    local_58.s.str = (Ch *)0x40500000018c30b;
    local_58.n = (Number)0x4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_58.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68,allocator);
    if (local_78.n.i64 != 0) {
      operator_delete__((void *)local_78.n);
    }
    OclLib::getString((OclLib *)&local_78.s,
                      (cl_platform_id)
                      (doc->
                      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ).data_.n,0x903);
    String::toJSON(&local_68,(Document *)&local_78.s);
    local_58.s.str = (Ch *)0x40500000018d146;
    local_58.n = (Number)0x6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_58.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68,allocator);
    if (local_78.n.i64 != 0) {
      operator_delete__((void *)local_78.n);
    }
    OclLib::getString((OclLib *)&local_78.s,
                      (cl_platform_id)
                      (doc->
                      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ).data_.n,0x904);
    String::toJSON(&local_68,(Document *)&local_78.s);
    local_58.s.str = (Ch *)0x4050000001896a1;
    local_58.n = (Number)0xa;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_58.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68,allocator);
    in_RDX = extraout_RDX;
    if (local_78.n.i64 != 0) {
      operator_delete__((void *)local_78.n);
      in_RDX = extraout_RDX_00;
    }
  }
  VVar1.data_.s.str = (Ch *)in_RDX;
  VVar1.data_.n = (Number)this;
  return (Value)VVar1.data_;
}

Assistant:

rapidjson::Value xmrig::OclPlatform::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    if (!isValid()) {
        return Value(kNullType);
    }

    Value out(kObjectType);
    out.AddMember("index",      static_cast<uint64_t>(index()), allocator);
    out.AddMember("profile",    profile().toJSON(doc), allocator);
    out.AddMember("version",    version().toJSON(doc), allocator);
    out.AddMember("name",       name().toJSON(doc), allocator);
    out.AddMember("vendor",     vendor().toJSON(doc), allocator);
    out.AddMember("extensions", extensions().toJSON(doc), allocator);

    return out;
}